

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2_p.h
# Opt level: O3

void __thiscall QGles2CommandBuffer::resetCommands(QGles2CommandBuffer *this)

{
  long lVar1;
  QRhiBufferData *this_00;
  undefined8 *puVar2;
  ulong uVar3;
  
  (this->commands).p = 0;
  std::_Destroy_n_aux<false>::__destroy_n<QByteArray*,long_long>
            ((QByteArray *)(this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.ptr,
             (this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.s);
  (this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.s = 0;
  lVar1 = (this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase.s;
  if (0 < lVar1) {
    this_00 = (QRhiBufferData *)
              (this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase.ptr;
    uVar3 = lVar1 + 1;
    do {
      QRhiBufferData::~QRhiBufferData(this_00);
      this_00 = this_00 + 1;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  (this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase.s = 0;
  lVar1 = (this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.s;
  if (0 < lVar1) {
    puVar2 = (undefined8 *)(this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.ptr;
    uVar3 = lVar1 + 1;
    do {
      (**(code **)*puVar2)(puVar2);
      puVar2 = puVar2 + 3;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  (this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.s = 0;
  std::_Destroy_n_aux<false>::__destroy_n<QRhiPassResourceTracker*,long_long>
            ((QRhiPassResourceTracker *)
             (this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.super_QVLABaseBase.ptr,
             (this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.super_QVLABaseBase.s);
  (this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.super_QVLABaseBase.s = 0;
  this->currentPassResTrackerIndex = -1;
  return;
}

Assistant:

void resetCommands() {
        commands.reset();
        dataRetainPool.clear();
        bufferDataRetainPool.clear();
        imageRetainPool.clear();

        passResTrackers.clear();
        currentPassResTrackerIndex = -1;
    }